

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

int Gia_ManEquivCountClasses(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int Id;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar1 = p->nObjs;
    iVar3 = 0;
    for (Id = 1; Id < iVar1; Id = Id + 1) {
      iVar2 = Gia_ObjIsHead(p,Id);
      iVar3 = iVar3 + iVar2;
    }
  }
  return iVar3;
}

Assistant:

int Gia_ManEquivCountClasses( Gia_Man_t * p )
{
    int i, Counter = 0;
    if ( p->pReprs == NULL )
        return 0;
    for ( i = 1; i < Gia_ManObjNum(p); i++ )
        Counter += Gia_ObjIsHead(p, i);
    return Counter;
}